

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O2

void TypeCheck_MethodCall(KonohaContext *kctx,KonohaStack *sfp)

{
  kNode *node;
  KClass *reqc;
  undefined8 *puVar1;
  kToken *pkVar2;
  KClass *c;
  _func_kNode_ptr_KonohaContext_ptr_kNode_ptr_kToken_ptr_kNameSpace_ptr_kinfotag_t_char_ptr_varargs
  *p_Var3;
  _func_uintptr_t_KonohaContext_ptr_kObject_ptr *p_Var4;
  undefined8 uVar5;
  kNameSpace *ns;
  kNode *pkVar6;
  kMethod *mtd;
  byte *pbVar7;
  KClass *pKVar8;
  kString *pkVar9;
  uintptr_t uVar10;
  uintptr_t uVar11;
  long lVar12;
  
  node = sfp[1].field_0.asNode;
  ns = kNode_GetNameSpace(kctx,node);
  reqc = ((sfp[3].field_0.asObject)->h).ct;
  (*(kctx->platApi->ConsoleModule).ReportDebugMessage)
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"TypeCheck_MethodCall",0x2f3,"tracing..");
  (*kctx->klib->DumpObject)
            (kctx,(kObject_conflict *)node,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"TypeCheck_MethodCall",0x2f5);
  if (((((node->field_5).NodeList)->h).ct)->baseTypeId != 6) {
    __assert_fail("((((expr->NodeList)->h.ct)->baseTypeId) == KType_Array)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
                  ,0x2f6,"void TypeCheck_MethodCall(KonohaContext *, KonohaStack *)");
  }
  mtd = *(((node->field_5).NodeList)->field_2).MethodItems;
  if (mtd == (kMethod *)0x0) {
    __assert_fail("mtd != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
                  ,0x2f8,"void TypeCheck_MethodCall(KonohaContext *, KonohaStack *)");
  }
  if (((mtd->h).ct)->baseTypeId == 8) {
LAB_001138b7:
    pkVar6 = TypeCheckMethodParam(kctx,mtd,node,ns,reqc);
  }
  else {
    pkVar6 = (*kctx->klib->TypeCheckNodeAt)
                       (kctx,node,1,ns,
                        (KClass *)
                        (((kctx->share->classTable).field_1.keyValueItems)->field_2).ObjectValue,0);
    if (pkVar6->nodeType == 0x18) goto LAB_00113b36;
    puVar1 = *(undefined8 **)&((node->field_5).StmtNameSpace)->packageId;
    pkVar2 = (kToken *)*puVar1;
    if ((pkVar2->h).ct != (KClass *)(*kctx->runtimeModels)[1].setupModelContext) {
      __assert_fail("(((methodToken)->h.ct) == ((KParserModel *)kctx->runtimeModels[0])->cToken)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
                    ,0x2d7,"kMethod *LookupMethod(KonohaContext *, kNode *, kNameSpace *)");
    }
    c = *(KClass **)
         ((kctx->share->classTable).field_1.bytebuf +
         (ulong)(*(uint *)(puVar1[1] + 0x1c) & 0xfffffff) * 8);
    lVar12 = ((ulong)((node->field_5).StmtNameSpace)->parentNULL >> 3) - 2;
    mtd = kNameSpace_GetMethodByParamSizeNULL
                    (kctx,ns,c,pkVar2->symbol,(int)lVar12,KMethodMatch_CamelStyle);
    if ((mtd == (kMethod *)0x0) && (lVar12 == 0)) {
      pbVar7 = (byte *)(*((((pkVar2->field_2).text)->h).ct)->unbox)(kctx);
      if ((pbVar7[1] == 0x6f) &&
         (((*pbVar7 | 0x20) == 0x74 &&
          (pKVar8 = (*kctx->klib->kNameSpace_GetClassByFullName)
                              (kctx,ns,(char *)(pbVar7 + 2),((pkVar2->field_2).text)->bytesize - 2,
                               (KClass *)0x0), pKVar8 != (KClass *)0x0)))) {
        mtd = (*kctx->klib->kNameSpace_GetCoercionMethodNULL)(kctx,ns,c,pKVar8);
        goto LAB_001139f6;
      }
LAB_001139ff:
      if ((pkVar2->field_2).text == kctx->share->emptyString) {
        mtd = (kMethod *)0x0;
      }
      else {
        mtd = kNameSpace_GetMethodByParamSizeNULL(kctx,ns,c,0,1,KMethodMatch_NoOption);
      }
      p_Var3 = kctx->klib->MessageNode;
      pkVar9 = (*kctx->klib->KClass_shortName)(kctx,c);
      p_Var4 = ((pkVar9->h).ct)->unbox;
      pkVar9 = (*kctx->klib->KClass_shortName)(kctx,c);
      uVar10 = (*p_Var4)(kctx,(kObject_conflict *)pkVar9);
      uVar5 = *(undefined8 *)(KSymbol_prefixText_prefixes + (ulong)(pkVar2->symbol >> 0x1d) * 8);
      pkVar9 = KSymbol_GetString(kctx,pkVar2->symbol);
      p_Var4 = ((pkVar9->h).ct)->unbox;
      pkVar9 = KSymbol_GetString(kctx,pkVar2->symbol);
      uVar11 = (*p_Var4)(kctx,(kObject_conflict *)pkVar9);
      (*p_Var3)(kctx,node,pkVar2,ns,ErrTag,"undefined method: %s.%s%s",uVar10,uVar5,uVar11);
      if (mtd != (kMethod *)0x0) goto LAB_00113aff;
    }
    else {
LAB_001139f6:
      if (mtd == (kMethod *)0x0) goto LAB_001139ff;
LAB_00113aff:
      if (((mtd->flag & 0x80000) == 0) ||
         (mtd = LookupOverloadedMethod(kctx,mtd,node,ns), mtd != (kMethod *)0x0)) goto LAB_001138b7;
    }
    if (pkVar6->nodeType != 0x18) {
      pkVar6 = node;
    }
  }
LAB_00113b36:
  sfp[-4].field_0.asNode = pkVar6;
  (*kctx->klib->CheckSafePoint)(kctx,sfp,0);
  return;
}

Assistant:

static KMETHOD TypeCheck_MethodCall(KonohaContext *kctx, KonohaStack *sfp)
{
	VAR_TypeCheck(expr, ns, reqc);
	kNode *texpr = K_NULLNODE;
	KDump(expr);
	DBG_ASSERT(IS_Array(expr->NodeList));
	kMethod *mtd = expr->NodeList->MethodItems[0];
	DBG_ASSERT(mtd != NULL);
	if(!IS_Method(mtd)) {
		texpr = KLIB TypeCheckNodeAt(kctx, expr, 1, ns, KClass_INFER, 0);
		mtd = (kNode_IsError(texpr)) ? NULL : LookupMethod(kctx, expr, ns);
	}
	if(mtd != NULL) {
		texpr = TypeCheckMethodParam(kctx, mtd, expr, ns, reqc);
		KReturn(texpr);
	}
	if(kNode_IsError(texpr)) {
		KReturn(texpr);
	}
	KReturn(expr);
}